

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLine.cpp
# Opt level: O2

string * __thiscall
slang::CommandLine::getHelpText_abi_cxx11_
          (string *__return_storage_ptr__,CommandLine *this,string_view overview)

{
  pointer psVar1;
  size_t sVar2;
  size_type sVar3;
  pointer ppVar4;
  pointer ppVar5;
  size_type sVar6;
  pointer psVar7;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v9::basic_format_context<fmt::v9::appender,_char>_>_2
  in_R9;
  element_type *peVar8;
  ulong uVar9;
  format_args args;
  format_args args_00;
  format_args args_01;
  format_args args_02;
  format_args args_03;
  string_view fmt;
  string_view fmt_00;
  string_view fmt_01;
  string_view fmt_02;
  string_view fmt_03;
  string key;
  string indent;
  vector<std::pair<slang::CommandLine::Option_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<slang::CommandLine::Option_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  lines;
  basic_string_view<char,_std::char_traits<char>_> local_50;
  
  indent._M_dataplus._M_p = overview._M_str;
  indent._M_string_length = overview._M_len;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if (indent._M_string_length != 0) {
    args.field_1.values_ = in_R9.values_;
    args.desc_ = (unsigned_long_long)&indent;
    fmt.size_ = 0xd;
    fmt.data_ = (char *)0xe;
    ::fmt::v9::vformat_abi_cxx11_(&key,(v9 *)"OVERVIEW: {}\n\n",fmt,args);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&key);
    std::__cxx11::string::~string((string *)&key);
  }
  indent._M_dataplus._M_p = (this->programName)._M_dataplus._M_p;
  indent._M_string_length = (this->programName)._M_string_length;
  args_00.field_1.values_ = in_R9.values_;
  args_00.desc_ = (unsigned_long_long)&indent;
  fmt_00.size_ = 0xd;
  fmt_00.data_ = (char *)0x13;
  ::fmt::v9::vformat_abi_cxx11_(&key,(v9 *)"USAGE: {} [options]",fmt_00,args_00);
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  std::__cxx11::string::~string((string *)&key);
  peVar8 = (this->positional).
           super___shared_ptr<slang::CommandLine::Option,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar8 != (element_type *)0x0) {
    indent._M_dataplus._M_p = (peVar8->valueName)._M_dataplus._M_p;
    indent._M_string_length = (peVar8->valueName)._M_string_length;
    args_01.field_1.values_ = in_R9.values_;
    args_01.desc_ = (unsigned_long_long)&indent;
    fmt_01.size_ = 0xd;
    fmt_01.data_ = (char *)0x6;
    ::fmt::v9::vformat_abi_cxx11_(&key,(v9 *)" {}...",fmt_01,args_01);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&key);
  }
  key._M_string_length = (size_type)"\n\nOPTIONS:\n";
  key._M_dataplus._M_p = (pointer)0xb;
  std::__cxx11::string::append<std::basic_string_view<char,std::char_traits<char>>>
            ((string *)__return_storage_ptr__,
             (basic_string_view<char,_std::char_traits<char>_> *)&key);
  lines.
  super__Vector_base<std::pair<slang::CommandLine::Option_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<slang::CommandLine::Option_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  lines.
  super__Vector_base<std::pair<slang::CommandLine::Option_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<slang::CommandLine::Option_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  lines.
  super__Vector_base<std::pair<slang::CommandLine::Option_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<slang::CommandLine::Option_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  psVar1 = (this->orderedOptions).
           super__Vector_base<std::shared_ptr<slang::CommandLine::Option>,_std::allocator<std::shared_ptr<slang::CommandLine::Option>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  uVar9 = 0;
  for (psVar7 = (this->orderedOptions).
                super__Vector_base<std::shared_ptr<slang::CommandLine::Option>,_std::allocator<std::shared_ptr<slang::CommandLine::Option>_>_>
                ._M_impl.super__Vector_impl_data._M_start; psVar7 != psVar1; psVar7 = psVar7 + 1) {
    std::__cxx11::string::string
              ((string *)&key,
               (string *)
               &((psVar7->super___shared_ptr<slang::CommandLine::Option,_(__gnu_cxx::_Lock_policy)2>
                 )._M_ptr)->allArgNames);
    peVar8 = (psVar7->super___shared_ptr<slang::CommandLine::Option,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr;
    if ((peVar8->valueName)._M_string_length != 0) {
      if (*(peVar8->valueName)._M_dataplus._M_p != '=') {
        std::__cxx11::string::push_back((char)&key);
      }
      std::__cxx11::string::append((string *)&key);
      peVar8 = (psVar7->super___shared_ptr<slang::CommandLine::Option,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr;
    }
    sVar3 = key._M_string_length;
    indent._M_dataplus._M_p = (pointer)peVar8;
    std::
    vector<std::pair<slang::CommandLine::Option*,std::__cxx11::string>,std::allocator<std::pair<slang::CommandLine::Option*,std::__cxx11::string>>>
    ::emplace_back<slang::CommandLine::Option*,std::__cxx11::string>
              ((vector<std::pair<slang::CommandLine::Option*,std::__cxx11::string>,std::allocator<std::pair<slang::CommandLine::Option*,std::__cxx11::string>>>
                *)&lines,(Option **)&indent,&key);
    if (uVar9 <= sVar3) {
      uVar9 = sVar3;
    }
    std::__cxx11::string::~string((string *)&key);
  }
  key._M_string_length = 1;
  key._M_dataplus._M_p = " ";
  args_02.field_1.values_ = in_R9.values_;
  args_02.desc_ = (unsigned_long_long)&key;
  fmt_02.size_ = 0x4d;
  fmt_02.data_ = (char *)0x7;
  key.field_2._M_allocated_capacity = uVar9 + 2;
  ::fmt::v9::vformat_abi_cxx11_(&indent,(v9 *)"  {:{}}",fmt_02,args_02);
  ppVar4 = lines.
           super__Vector_base<std::pair<slang::CommandLine::Option_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<slang::CommandLine::Option_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (ppVar5 = lines.
                super__Vector_base<std::pair<slang::CommandLine::Option_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<slang::CommandLine::Option_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; ppVar5 != ppVar4; ppVar5 = ppVar5 + 1) {
    key._M_dataplus._M_p = (ppVar5->second)._M_dataplus._M_p;
    key._M_string_length = (ppVar5->second)._M_string_length;
    args_03.field_1.values_ = in_R9.values_;
    args_03.desc_ = (unsigned_long_long)&key;
    fmt_03.size_ = 0x4d;
    fmt_03.data_ = (char *)0x7;
    key.field_2._M_allocated_capacity = uVar9 + 2;
    ::fmt::v9::vformat_abi_cxx11_((string *)&local_50,(v9 *)"  {:{}}",fmt_03,args_03);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_50);
    sVar2 = (ppVar5->first->desc)._M_string_length;
    if (sVar2 != 0) {
      key._M_string_length = (size_type)(ppVar5->first->desc)._M_dataplus._M_p;
      key._M_dataplus._M_p = (pointer)sVar2;
      while( true ) {
        sVar6 = std::basic_string_view<char,_std::char_traits<char>_>::find
                          ((basic_string_view<char,_std::char_traits<char>_> *)&key,'\n',0);
        if (sVar6 == 0xffffffffffffffff) break;
        local_50 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                             ((basic_string_view<char,_std::char_traits<char>_> *)&key,0,sVar6 + 1);
        std::__cxx11::string::append<std::basic_string_view<char,std::char_traits<char>>>
                  ((string *)__return_storage_ptr__,&local_50);
        std::__cxx11::string::append((string *)__return_storage_ptr__);
        key._0_16_ = std::basic_string_view<char,_std::char_traits<char>_>::substr
                               ((basic_string_view<char,_std::char_traits<char>_> *)&key,sVar6 + 1,
                                0xffffffffffffffff);
      }
      std::__cxx11::string::append<std::basic_string_view<char,std::char_traits<char>>>
                ((string *)__return_storage_ptr__,
                 (basic_string_view<char,_std::char_traits<char>_> *)&key);
    }
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  std::__cxx11::string::~string((string *)&indent);
  std::
  vector<std::pair<slang::CommandLine::Option_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<slang::CommandLine::Option_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector(&lines);
  return __return_storage_ptr__;
}

Assistant:

std::string CommandLine::getHelpText(string_view overview) const {
    std::string result;
    if (!overview.empty())
        result = fmt::format("OVERVIEW: {}\n\n"sv, overview);

    result += fmt::format("USAGE: {} [options]"sv, programName);
    if (positional)
        result += fmt::format(" {}...", positional->valueName);

    result += "\n\nOPTIONS:\n"sv;

    // For each option group that takes a value, tack on the value name.
    // Then compute the maximum length of any particular group's key.
    size_t maxLen = 0;
    std::vector<std::pair<Option*, std::string>> lines;
    for (auto& opt : orderedOptions) {
        std::string key = opt->allArgNames;
        std::string& val = opt->valueName;
        if (!val.empty()) {
            if (val[0] != '=')
                key += ' ';
            key += val;
        }

        maxLen = std::max(maxLen, key.length());
        lines.emplace_back(opt.get(), std::move(key));
    }

    // Add two spaces so that the description text is offset from the longest option name.
    maxLen += 2;

    // Finally append all groups to the output.
    std::string indent = fmt::format("  {:{}}"sv, " "sv, maxLen);
    for (auto& [opt, key] : lines) {
        result += fmt::format("  {:{}}"sv, key, maxLen);
        if (!opt->desc.empty()) {
            string_view desc = opt->desc;
            while (true) {
                size_t index = desc.find_first_of('\n');
                if (index == string_view::npos) {
                    result += desc;
                    break;
                }

                result += desc.substr(0, index + 1);
                result += indent;
                desc = desc.substr(index + 1);
            }
        }
        result += "\n";
    }

    return result;
}